

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O3

int set_message_id(MESSAGE_HANDLE message,uint64_t next_message_id)

{
  int iVar1;
  PROPERTIES_HANDLE in_RAX;
  LOGGER_LOG p_Var2;
  AMQP_VALUE message_id_value;
  int iVar3;
  char *pcVar4;
  PROPERTIES_HANDLE properties;
  PROPERTIES_HANDLE local_18;
  
  local_18 = in_RAX;
  iVar1 = message_get_properties(message,&local_18);
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x254;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x254;
    }
    pcVar4 = "Could not retrieve message properties";
    iVar3 = 0x253;
LAB_0012a2c0:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
              ,"set_message_id",iVar3,1,pcVar4);
    return iVar1;
  }
  if ((local_18 == (PROPERTIES_HANDLE)0x0) &&
     (local_18 = properties_create(), local_18 == (PROPERTIES_HANDLE)0x0)) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x262;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x262;
    }
    pcVar4 = "Could not create message properties";
    iVar3 = 0x261;
    goto LAB_0012a2c0;
  }
  message_id_value = amqpvalue_create_message_id_ulong(next_message_id);
  if (message_id_value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x26c;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"set_message_id",0x26b,1,"Could not create message id value");
    }
    goto LAB_0012a40a;
  }
  iVar1 = properties_set_message_id(local_18,message_id_value);
  if (iVar1 == 0) {
    iVar1 = message_set_properties(message,local_18);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x27c;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Could not set message properties";
        iVar3 = 0x27b;
        goto LAB_0012a3c0;
      }
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x275;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "Could not set message Id on the properties";
      iVar3 = 0x274;
LAB_0012a3c0:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                ,"set_message_id",iVar3,1,pcVar4);
    }
  }
  amqpvalue_destroy(message_id_value);
LAB_0012a40a:
  properties_destroy(local_18);
  return iVar1;
}

Assistant:

static int set_message_id(MESSAGE_HANDLE message, uint64_t next_message_id)
{
    int result;
    PROPERTIES_HANDLE properties;

    /* Codes_SRS_AMQP_MANAGEMENT_01_094: [ In order to set the message Id on the message, the properties shall be obtained by calling `message_get_properties`. ]*/
    if (message_get_properties(message, &properties) != 0)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_098: [ If any API fails while setting the message Id, `amqp_management_execute_operation_async` shall fail and return a non-zero value. ]*/
        LogError("Could not retrieve message properties");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_099: [ If the properties were not set on the message, a new properties instance shall be created by calling `properties_create`. ]*/
        if (properties == NULL)
        {
            properties = properties_create();
        }

        if (properties == NULL)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_098: [ If any API fails while setting the message Id, `amqp_management_execute_operation_async` shall fail and return a non-zero value. ]*/
            LogError("Could not create message properties");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_095: [ A message Id with the next ulong value to be used shall be created by calling `amqpvalue_create_message_id_ulong`. ]*/
            AMQP_VALUE message_id = amqpvalue_create_message_id_ulong(next_message_id);
            if (message_id == NULL)
            {
                /* Codes_SRS_AMQP_MANAGEMENT_01_098: [ If any API fails while setting the message Id, `amqp_management_execute_operation_async` shall fail and return a non-zero value. ]*/
                LogError("Could not create message id value");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_AMQP_MANAGEMENT_01_096: [ The message Id value shall be set on the properties by calling `properties_set_message_id`. ]*/
                if (properties_set_message_id(properties, message_id) != 0)
                {
                    /* Codes_SRS_AMQP_MANAGEMENT_01_098: [ If any API fails while setting the message Id, `amqp_management_execute_operation_async` shall fail and return a non-zero value. ]*/
                    LogError("Could not set message Id on the properties");
                    result = MU_FAILURE;
                }
                /* Codes_SRS_AMQP_MANAGEMENT_01_097: [ The properties thus modified to contain the message Id shall be set on the message by calling `message_set_properties`. ]*/
                else if (message_set_properties(message, properties) != 0)
                {
                    /* Codes_SRS_AMQP_MANAGEMENT_01_098: [ If any API fails while setting the message Id, `amqp_management_execute_operation_async` shall fail and return a non-zero value. ]*/
                    LogError("Could not set message properties");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }

                amqpvalue_destroy(message_id);
            }

            /* Codes_SRS_AMQP_MANAGEMENT_01_100: [ After setting the properties, the properties instance shall be freed by `properties_destroy`. ]*/
            properties_destroy(properties);
        }
    }

    return result;
}